

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

bool anon_unknown.dwarf_eb892::checkPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int width,int height)

{
  float fVar1;
  ushort uVar2;
  long lVar3;
  ostream *poVar4;
  long *plVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  float i;
  uif x;
  
  if (0 < height) {
    uVar10 = 0;
    bVar11 = false;
    do {
      if (0 < width) {
        lVar3 = sampleCount->_sizeY;
        puVar6 = sampleCount->_data;
        uVar8 = 0;
        do {
          if (puVar6[lVar3 * uVar10 + uVar8] != 0) {
            iVar9 = ((int)uVar10 * width + (int)uVar8) % 0x801;
            i = (float)iVar9;
            uVar7 = 0;
            do {
              fVar1 = half::_toFloat[ph->_data[ph->_sizeY * uVar10 + uVar8][uVar7]._h].f;
              uVar2 = (ushort)((uint)i >> 0x10);
              if (iVar9 != 0) {
                if (half::_eLut[(uint)i >> 0x17] == 0) {
                  uVar2 = half::convert((int)i);
                }
                else {
                  uVar2 = half::_eLut[(uint)i >> 0x17] +
                          (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0)
                                 >> 0xd);
                }
              }
              if ((fVar1 != half::_toFloat[uVar2].f) || (NAN(fVar1) || NAN(half::_toFloat[uVar2].f))
                 ) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", sample ",9);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
                poVar4 = operator<<(poVar4,(half)ph->_data[uVar10 * ph->_sizeY + uVar8][uVar7]._h);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
                plVar5 = (long *)std::ostream::operator<<(poVar4,iVar9);
                std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                std::ostream::put((char)plVar5);
                std::ostream::flush();
                std::ostream::flush();
                return bVar11;
              }
              uVar7 = uVar7 + 1;
              lVar3 = sampleCount->_sizeY;
              puVar6 = sampleCount->_data;
            } while (uVar7 < puVar6[lVar3 * uVar10 + uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)width);
      }
      bVar11 = height - 1 <= uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)height);
  }
  return true;
}

Assistant:

bool checkPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph,
                  int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    return true;
}